

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_fkhash_trie.hpp
# Opt level: O2

void __thiscall
poplar::
compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::expand_(compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
          *this)

{
  uint64_t node_id;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint64_t i;
  ulong i_00;
  uint64_t cnt;
  this_type new_ht;
  compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  local_1a8;
  
  compact_fkhash_trie(&local_1a8,(this->capa_size_).bits_ + 1,(this->symb_size_).bits_,0);
  for (i_00 = 0; i_00 < (this->capa_size_).mask_ + 1; i_00 = i_00 + 1) {
    node_id = compact_vector::get(&this->ids_,i_00);
    if (node_id != (this->capa_size_).mask_) {
      uVar1 = get_dsp_(this,i_00);
      uVar5 = (this->table_).size_;
      uVar2 = get_quo_(this,i_00);
      if (uVar1 <= i_00) {
        uVar5 = 0;
      }
      uVar5 = bijective_hash::split_mix_hasher::hash_inv
                        (&this->hasher_,
                         uVar2 << ((ulong)(byte)(this->capa_size_).bits_ & 0x3f) |
                         (i_00 - uVar1) + uVar5);
      uVar5 = bijective_hash::split_mix_hasher::hash(&local_1a8.hasher_,uVar5);
      uVar4 = (ulong)(byte)local_1a8.capa_size_.bits_;
      uVar2 = 0;
      uVar1 = local_1a8.capa_size_.mask_ & uVar5;
      while( true ) {
        uVar3 = compact_vector::get(&local_1a8.ids_,uVar1);
        if (uVar3 == local_1a8.capa_size_.mask_) break;
        uVar2 = uVar2 + 1;
        uVar1 = uVar1 + 1 & local_1a8.capa_size_.mask_;
      }
      update_slot_(&local_1a8,uVar1,uVar5 >> (uVar4 & 0x3f),uVar2,node_id);
    }
  }
  local_1a8.size_ = this->size_;
  std::
  swap<poplar::compact_fkhash_trie<90u,4u,poplar::compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher>,poplar::standard_hash_table<80u,poplar::hash::vigna_hasher>,poplar::bijective_hash::split_mix_hasher>>
            (this,&local_1a8);
  ~compact_fkhash_trie(&local_1a8);
  return;
}

Assistant:

void expand_() {
        this_type new_ht{capa_bits() + 1, symb_size_.bits()};
#ifdef POPLAR_EXTRA_STATS
        new_ht.num_resize_ = num_resize_ + 1;
#endif

        for (uint64_t i = 0; i < capa_size_.size(); ++i) {
            uint64_t node_id = ids_[i];

            if (node_id == capa_size_.mask()) {
                // encounter an empty slot
                continue;
            }

            uint64_t dist = get_dsp_(i);
            uint64_t init_id = dist <= i ? i - dist : table_.size() - (dist - i);
            uint64_t key = hasher_.hash_inv(get_quo_(i) << capa_size_.bits() | init_id);

            auto [quo, mod] = new_ht.decompose_(new_ht.hasher_.hash(key));

            for (uint64_t new_i = mod, cnt = 0;; new_i = new_ht.right_(new_i), ++cnt) {
                if (new_ht.ids_[new_i] == new_ht.capa_size_.mask()) {
                    // encounter an empty slot
                    new_ht.update_slot_(new_i, quo, cnt, node_id);
                    break;
                }
            }
        }

        new_ht.size_ = size_;
        std::swap(*this, new_ht);
    }